

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

void filemgr_dirty_update_commit
               (filemgr *file,filemgr_dirty_update_node *commit_node,err_log_callback *log_callback)

{
  avl_node *paVar1;
  filemgr *pfVar2;
  filemgr *node;
  avl_node *node_00;
  filemgr *file_00;
  list remove_queue;
  list local_38;
  
  local_38.head = (list_elem *)0x0;
  local_38.tail = (list_elem *)0x0;
  if (commit_node != (filemgr_dirty_update_node *)0x0) {
    filemgr_dirty_update_flush(file,commit_node,log_callback);
  }
  pthread_spin_lock(&file->dirty_update_lock);
  file->latest_dirty_update = (filemgr_dirty_update_node *)0x0;
  paVar1 = avl_first(&file->dirty_update_idx);
  while (node_00 = paVar1, node_00 != (avl_node *)0x0) {
    paVar1 = avl_next(node_00);
    if ((*(char *)&node_00[1].left == '\x01') && (*(int *)((long)&node_00[1].left + 4) == 0)) {
      avl_remove(&file->dirty_update_idx,node_00);
      list_push_front(&local_38,(list_elem *)node_00);
    }
  }
  pthread_spin_unlock(&file->dirty_update_lock);
  file_00 = (filemgr *)local_38.head;
  while (file_00 != (filemgr *)0x0) {
    node = file_00;
    pfVar2 = (filemgr *)list_remove(&local_38,(list_elem *)file_00);
    _filemgr_dirty_update_remove_node(file_00,(filemgr_dirty_update_node *)node);
    file_00 = pfVar2;
  }
  return;
}

Assistant:

void filemgr_dirty_update_commit(struct filemgr *file,
                                 struct filemgr_dirty_update_node *commit_node,
                                 err_log_callback *log_callback)
{
    struct avl_node *a;
    struct filemgr_dirty_update_node *node;
    struct list remove_queue;
    struct list_elem *le;

    // 1. write back all blocks in the given (committed) node
    // 2. remove all other immutable dirty update entries
    list_init(&remove_queue);
    if (commit_node) {
        filemgr_dirty_update_flush(file, commit_node, log_callback);
    }

    spin_lock(&file->dirty_update_lock);
    file->latest_dirty_update = NULL;

    a = avl_first(&file->dirty_update_idx);
    while (a) {
        node = _get_entry(a, struct filemgr_dirty_update_node, avl);
        a = avl_next(a);

        if (node->immutable &&
            atomic_get_uint32_t(&node->ref_count) == 0) {
            // detach from tree and insert into remove queue
            avl_remove(&file->dirty_update_idx, &node->avl);
            list_push_front(&remove_queue, &node->le);
        }
    }

    spin_unlock(&file->dirty_update_lock);

    le = list_begin(&remove_queue);
    while (le) {
        node = _get_entry(le, struct filemgr_dirty_update_node, le);
        le = list_remove(&remove_queue, &node->le);
        _filemgr_dirty_update_remove_node(file, node);
    }
}